

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

ENetHost *
enet_host_create(ENetAddress *address,size_t peerCount,size_t channelLimit,
                enet_uint32 incomingBandwidth,enet_uint32 outgoingBandwidth)

{
  undefined8 uVar1;
  undefined8 uVar2;
  enet_uint16 eVar3;
  int iVar4;
  uint uVar5;
  ENetHost *pEVar6;
  ENetPeer *pEVar7;
  time_t tVar8;
  ENetPeer *pEVar9;
  long lVar10;
  ENetPeer *pEVar11;
  size_t sVar12;
  long lVar13;
  sockaddr local_58;
  undefined4 uStack_48;
  undefined4 uStack_44;
  uint local_40;
  
  if (peerCount < 0x10000) {
    pEVar6 = (ENetHost *)(*callbacks.malloc)(0x2b28);
    if (pEVar6 == (ENetHost *)0x0) {
      pEVar6 = (ENetHost *)(*callbacks.no_memory)();
      return pEVar6;
    }
    memset(pEVar6,0,0x2b28);
    pEVar7 = (ENetPeer *)(*callbacks.malloc)(peerCount * 0x1f8);
    if (pEVar7 == (ENetPeer *)0x0) {
      pEVar6 = (ENetHost *)(*callbacks.no_memory)();
      return pEVar6;
    }
    pEVar6->peers = pEVar7;
    if (pEVar7 != (ENetPeer *)0x0) {
      memset(pEVar7,0,peerCount * 0x1f8);
      iVar4 = socket(10,2,0);
      pEVar6->socket = iVar4;
      if (iVar4 != -1) {
        local_58._0_8_ = local_58._0_8_ & 0xffffffff00000000;
        setsockopt(iVar4,0x29,0x1a,&local_58,4);
      }
      iVar4 = pEVar6->socket;
      if (iVar4 != -1) {
        if (address == (ENetAddress *)0x0) {
          enet_socket_set_option(iVar4,ENET_SOCKOPT_NONBLOCK,1);
          local_58.sa_family = 1;
          local_58.sa_data[0] = '\0';
          local_58.sa_data[1] = '\0';
          setsockopt(pEVar6->socket,1,6,&local_58,4);
          local_58.sa_family = 0;
          local_58.sa_data[0] = '\x04';
          local_58.sa_data[1] = '\0';
          setsockopt(pEVar6->socket,1,8,&local_58,4);
          local_58.sa_family = 0;
          local_58.sa_data[0] = '\x04';
          local_58.sa_data[1] = '\0';
          setsockopt(pEVar6->socket,1,7,&local_58,4);
          local_58._0_8_ = (ulong)(uint)local_58.sa_data._2_4_ << 0x20;
          setsockopt(pEVar6->socket,0x29,0x1a,&local_58,4);
LAB_00106248:
          sVar12 = 0xff;
          if (0xffffffffffffff00 < channelLimit - 0x100) {
            sVar12 = channelLimit;
          }
          pEVar6->randomSeed = (int)((ulong)pEVar6 / 0xffffffff) + (int)pEVar6;
          tVar8 = time((time_t *)0x0);
          uVar5 = (int)tVar8 + pEVar6->randomSeed;
          pEVar6->randomSeed = uVar5 * 0x10000 | uVar5 >> 0x10;
          pEVar6->channelLimit = sVar12;
          pEVar6->incomingBandwidth = incomingBandwidth;
          pEVar6->outgoingBandwidth = outgoingBandwidth;
          pEVar6->bandwidthThrottleEpoch = 0;
          pEVar6->mtu = 0x570;
          pEVar6->recalculateBandwidthLimits = 0;
          pEVar6->peerCount = peerCount;
          pEVar6->commandCount = 0;
          pEVar6->bufferCount = 0;
          pEVar6->checksum = (ENetChecksumCallback)0x0;
          uVar1 = _setsockopt;
          *(undefined8 *)&(pEVar6->receivedAddress).host.__in6_u = _in6addr_any;
          *(undefined8 *)((long)&(pEVar6->receivedAddress).host.__in6_u + 8) = uVar1;
          (pEVar6->receivedAddress).port = 0;
          pEVar6->totalQueued = 0;
          pEVar6->receivedData = (enet_uint8 *)0x0;
          pEVar6->receivedDataLength = 0;
          pEVar6->totalSentData = 0;
          pEVar6->totalSentPackets = 0;
          pEVar6->totalReceivedData = 0;
          pEVar6->totalReceivedPackets = 0;
          pEVar6->connectedPeers = 0;
          pEVar6->bandwidthLimitedPeers = 0;
          pEVar6->duplicatePeers = 0xffff;
          pEVar6->maximumPacketSize = 0x2000000;
          pEVar6->maximumWaitingData = 0x2000000;
          pEVar6->intercept = (ENetInterceptCallback)0x0;
          (pEVar6->compressor).context = (void *)0x0;
          (pEVar6->compressor).compress =
               (_func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *)0x0;
          (pEVar6->compressor).decompress =
               (_func_size_t_void_ptr_enet_uint8_ptr_size_t_enet_uint8_ptr_size_t *)0x0;
          (pEVar6->compressor).destroy = (_func_void_void_ptr *)0x0;
          (pEVar6->dispatchQueue).sentinel.next = &(pEVar6->dispatchQueue).sentinel;
          (pEVar6->dispatchQueue).sentinel.previous = &(pEVar6->dispatchQueue).sentinel;
          if ((long)pEVar6->peerCount < 1) {
            return pEVar6;
          }
          pEVar7 = pEVar6->peers;
          lVar13 = 0;
          pEVar9 = pEVar7;
          do {
            pEVar11 = (ENetPeer *)((long)&(pEVar7->dispatchList).next + lVar13);
            lVar10 = (long)pEVar7->unsequencedWindow + lVar13 + -0x58;
            *(ENetHost **)((long)&pEVar7->host + lVar13) = pEVar6;
            *(short *)((long)&pEVar7->incomingPeerID + lVar13) =
                 (short)((uint)((int)pEVar11 - (int)pEVar9) >> 3) * -0x1041;
            *(undefined2 *)(&pEVar7->outgoingSessionID + lVar13) = 0xffff;
            *(undefined8 *)((long)&pEVar7->data + lVar13) = 0;
            *(long *)lVar10 = lVar10;
            *(long *)((long)pEVar7->unsequencedWindow + lVar13 + -0x50) = lVar10;
            lVar10 = (long)pEVar7->unsequencedWindow + lVar13 + -0x48;
            *(long *)lVar10 = lVar10;
            *(long *)(lVar10 + 8) = lVar10;
            lVar10 = (long)pEVar7->unsequencedWindow + lVar13 + -0x38;
            *(long *)lVar10 = lVar10;
            *(long *)(lVar10 + 8) = lVar10;
            lVar10 = (long)pEVar7->unsequencedWindow + lVar13 + -0x28;
            *(long *)lVar10 = lVar10;
            *(long *)(lVar10 + 8) = lVar10;
            lVar10 = (long)pEVar7->unsequencedWindow + lVar13 + -0x18;
            *(long *)lVar10 = lVar10;
            *(long *)((long)pEVar7->unsequencedWindow + lVar13 + -0x10) = lVar10;
            enet_peer_reset(pEVar11);
            pEVar9 = pEVar6->peers;
            pEVar11 = (ENetPeer *)((long)&pEVar7[1].dispatchList.next + lVar13);
            lVar13 = lVar13 + 0x1f8;
          } while (pEVar11 < pEVar9 + pEVar6->peerCount);
          return pEVar6;
        }
        local_58.sa_data._0_2_ = address->port << 8 | address->port >> 8;
        local_58.sa_family = 10;
        local_58.sa_data._2_4_ = 0;
        uVar1 = *(undefined8 *)&(address->host).__in6_u;
        uVar2 = *(undefined8 *)((long)&(address->host).__in6_u + 8);
        local_58.sa_data._6_4_ = SUB84(uVar1,0);
        local_58.sa_data._10_4_ = SUB84((ulong)uVar1 >> 0x20,0);
        uStack_48 = (undefined4)uVar2;
        uStack_44 = (undefined4)((ulong)uVar2 >> 0x20);
        local_40 = (uint)address->sin6_scope_id;
        iVar4 = bind(iVar4,&local_58,0x1c);
        if (-1 < iVar4) {
          enet_socket_set_option(pEVar6->socket,ENET_SOCKOPT_NONBLOCK,1);
          local_58.sa_family = 1;
          local_58.sa_data[0] = '\0';
          local_58.sa_data[1] = '\0';
          setsockopt(pEVar6->socket,1,6,&local_58,4);
          local_58.sa_family = 0;
          local_58.sa_data[0] = '\x04';
          local_58.sa_data[1] = '\0';
          setsockopt(pEVar6->socket,1,8,&local_58,4);
          local_58.sa_family = 0;
          local_58.sa_data[0] = '\x04';
          local_58.sa_data[1] = '\0';
          setsockopt(pEVar6->socket,1,7,&local_58,4);
          local_58._0_8_ = (ulong)(uint)local_58.sa_data._2_4_ << 0x20;
          setsockopt(pEVar6->socket,0x29,0x1a,&local_58,4);
          iVar4 = enet_socket_get_address(pEVar6->socket,&pEVar6->address);
          if (iVar4 < 0) {
            eVar3 = address->sin6_scope_id;
            (pEVar6->address).port = address->port;
            (pEVar6->address).sin6_scope_id = eVar3;
            uVar1 = *(undefined8 *)((long)&(address->host).__in6_u + 8);
            *(undefined8 *)&(pEVar6->address).host.__in6_u = *(undefined8 *)&(address->host).__in6_u
            ;
            *(undefined8 *)((long)&(pEVar6->address).host.__in6_u + 8) = uVar1;
          }
          goto LAB_00106248;
        }
      }
      if (pEVar6->socket != -1) {
        close(pEVar6->socket);
      }
      (*callbacks.free)(pEVar6->peers);
    }
    (*callbacks.free)(pEVar6);
  }
  return (ENetHost *)0x0;
}

Assistant:

ENetHost * enet_host_create(const ENetAddress *address, size_t peerCount, size_t channelLimit, enet_uint32 incomingBandwidth, enet_uint32 outgoingBandwidth) {
        ENetHost *host;
        ENetPeer *currentPeer;

        if (peerCount > ENET_PROTOCOL_MAXIMUM_PEER_ID) {
            return NULL;
        }

        host = (ENetHost *) enet_malloc(sizeof(ENetHost));
        if (host == NULL) { return NULL; }
        memset(host, 0, sizeof(ENetHost));

        host->peers = (ENetPeer *) enet_malloc(peerCount * sizeof(ENetPeer));
        if (host->peers == NULL) {
            enet_free(host);
            return NULL;
        }

        memset(host->peers, 0, peerCount * sizeof(ENetPeer));

        host->socket = enet_socket_create(ENET_SOCKET_TYPE_DATAGRAM);
        if (host->socket != ENET_SOCKET_NULL) {
            enet_socket_set_option (host->socket, ENET_SOCKOPT_IPV6_V6ONLY, 0);
        }

        if (host->socket == ENET_SOCKET_NULL || (address != NULL && enet_socket_bind(host->socket, address) < 0)) {
            if (host->socket != ENET_SOCKET_NULL) {
                enet_socket_destroy(host->socket);
            }

            enet_free(host->peers);
            enet_free(host);

            return NULL;
        }

        enet_socket_set_option(host->socket, ENET_SOCKOPT_NONBLOCK, 1);
        enet_socket_set_option(host->socket, ENET_SOCKOPT_BROADCAST, 1);
        enet_socket_set_option(host->socket, ENET_SOCKOPT_RCVBUF, ENET_HOST_RECEIVE_BUFFER_SIZE);
        enet_socket_set_option(host->socket, ENET_SOCKOPT_SNDBUF, ENET_HOST_SEND_BUFFER_SIZE);
        enet_socket_set_option(host->socket, ENET_SOCKOPT_IPV6_V6ONLY, 0);

        if (address != NULL && enet_socket_get_address(host->socket, &host->address) < 0) {
            host->address = *address;
        }

        if (!channelLimit || channelLimit > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT) {
            channelLimit = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;
        }

        host->randomSeed                    = (enet_uint32) ((uintptr_t) host % UINT32_MAX);
        host->randomSeed                    += enet_host_random_seed();
        host->randomSeed                    = (host->randomSeed << 16) | (host->randomSeed >> 16);
        host->channelLimit                  = channelLimit;
        host->incomingBandwidth             = incomingBandwidth;
        host->outgoingBandwidth             = outgoingBandwidth;
        host->bandwidthThrottleEpoch        = 0;
        host->recalculateBandwidthLimits    = 0;
        host->mtu                           = ENET_HOST_DEFAULT_MTU;
        host->peerCount                     = peerCount;
        host->commandCount                  = 0;
        host->bufferCount                   = 0;
        host->checksum                      = NULL;
        host->receivedAddress.host          = ENET_HOST_ANY;
        host->receivedAddress.port          = 0;
        host->receivedData                  = NULL;
        host->receivedDataLength            = 0;
        host->totalSentData                 = 0;
        host->totalSentPackets              = 0;
        host->totalReceivedData             = 0;
        host->totalReceivedPackets          = 0;
        host->totalQueued                   = 0;
        host->connectedPeers                = 0;
        host->bandwidthLimitedPeers         = 0;
        host->duplicatePeers                = ENET_PROTOCOL_MAXIMUM_PEER_ID;
        host->maximumPacketSize             = ENET_HOST_DEFAULT_MAXIMUM_PACKET_SIZE;
        host->maximumWaitingData            = ENET_HOST_DEFAULT_MAXIMUM_WAITING_DATA;
        host->compressor.context            = NULL;
        host->compressor.compress           = NULL;
        host->compressor.decompress         = NULL;
        host->compressor.destroy            = NULL;
        host->intercept                     = NULL;

        enet_list_clear(&host->dispatchQueue);

        for (currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
            currentPeer->host = host;
            currentPeer->incomingPeerID    = currentPeer - host->peers;
            currentPeer->outgoingSessionID = currentPeer->incomingSessionID = 0xFF;
            currentPeer->data = NULL;

            enet_list_clear(&currentPeer->acknowledgements);
            enet_list_clear(&currentPeer->sentReliableCommands);
            enet_list_clear(&currentPeer->outgoingCommands);
            enet_list_clear(&currentPeer->outgoingSendReliableCommands);
            enet_list_clear(&currentPeer->dispatchedCommands);

            enet_peer_reset(currentPeer);
        }

        return host;
    }